

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoissonGenerator.h
# Opt level: O3

vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_> *
PoissonGenerator::generateJitteredGridPoints<PoissonGenerator::DefaultPRNG>
          (vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>
           *__return_storage_ptr__,uint32_t numPoints,DefaultPRNG *generator,bool isCircle,
          float jitterRadius,Point center)

{
  pointer *ppPVar1;
  uint32_t uVar2;
  iterator __position;
  uint uVar3;
  undefined4 extraout_EAX;
  uint uVar4;
  uint32_t y;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar13 [16];
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  Point local_98;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  float local_58;
  undefined1 local_48 [16];
  undefined1 auVar12 [16];
  
  local_78._8_4_ = in_XMM1_Dc;
  local_78._0_8_ = center._0_8_;
  local_78._12_4_ = in_XMM1_Dd;
  (__return_storage_ptr__->
  super__Vector_base<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>::reserve
            (__return_storage_ptr__,(ulong)numPoints);
  uVar7 = (ulong)SQRT((double)numPoints);
  uVar6 = (uint)uVar7;
  if (uVar6 != 0) {
    fVar10 = (float)(uVar7 & 0xffffffff);
    uVar4 = 0;
    do {
      local_88 = ZEXT416((uint)((float)uVar4 / fVar10));
      uVar5 = 0;
      do {
        fStack_64 = (float)uVar5 / fVar10;
        local_68 = (float)local_88._0_4_;
        uStack_60 = local_88._8_4_;
        uStack_5c = local_88._12_4_;
        do {
          do {
            uVar2 = generator->seed_;
            uVar3 = uVar2 * 0x3d84a161;
            generator->seed_ = uVar3;
            local_48 = ZEXT416((uint)((((float)(uVar2 * 0x7f3cf & 0x7fffff | 0x40000000) + -2.0) *
                                       0.5 + 1.0) * jitterRadius));
            fVar11 = ((float)(uVar3 & 0x7fffff | 0x40000000) + -2.0) * 0.5 * 6.2831855;
            local_58 = cosf(fVar11);
            fVar11 = sinf(fVar11);
            local_98.x = ((local_58 * (float)local_48._0_4_ + 0.0) - (float)local_78._0_4_) + 0.5 +
                         local_68;
            local_98.y = ((fVar11 * (float)local_48._0_4_ + 0.0) - (float)local_78._4_4_) + 0.5 +
                         fStack_64;
            local_98.valid_ = true;
          } while (local_98.x < 0.0);
          iVar8 = -(uint)(local_98.x <= 1.0);
          iVar9 = -(uint)(local_98.y <= 1.0);
          auVar13._4_4_ = iVar9;
          auVar13._0_4_ = iVar8;
          auVar13._8_4_ = iVar9;
          auVar13._12_4_ = iVar9;
          auVar12._8_8_ = auVar13._8_8_;
          auVar12._4_4_ = iVar8;
          auVar12._0_4_ = iVar8;
          uVar3 = movmskpd(extraout_EAX,auVar12);
        } while ((((uVar3 & 2) == 0) || ((uVar3 & 1) == 0)) || (local_98.y < 0.0));
        if ((!isCircle) ||
           ((local_98.x + -0.5) * (local_98.x + -0.5) + (local_98.y + -0.5) * (local_98.y + -0.5) <=
            0.25)) {
          __position._M_current =
               (__return_storage_ptr__->
               super__Vector_base<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>)
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<PoissonGenerator::Point,std::allocator<PoissonGenerator::Point>>::
            _M_realloc_insert<PoissonGenerator::Point_const&>
                      ((vector<PoissonGenerator::Point,std::allocator<PoissonGenerator::Point>> *)
                       __return_storage_ptr__,__position,&local_98);
          }
          else {
            (__position._M_current)->valid_ = true;
            *(undefined3 *)&(__position._M_current)->field_0x9 = local_98._9_3_;
            (__position._M_current)->x = local_98.x;
            (__position._M_current)->y = local_98.y;
            ppPVar1 = &(__return_storage_ptr__->
                       super__Vector_base<PoissonGenerator::Point,_std::allocator<PoissonGenerator::Point>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppPVar1 = *ppPVar1 + 1;
          }
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != uVar6);
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Point> generateJitteredGridPoints(uint32_t numPoints,
                                              PRNG& generator,
                                              bool isCircle = false,
                                              float jitterRadius = 0.004f,
                                              Point center = Point(0.5f, 0.5f)) {
  std::vector<Point> samplePoints;

  samplePoints.reserve(numPoints);

  const uint32_t gridSize = uint32_t(sqrt(numPoints));

  for (uint32_t x = 0; x != gridSize; x++) {
    for (uint32_t y = 0; y != gridSize; y++) {
      Point p;
      do {
        const Point offs = generateRandomPointAround(Point(0, 0), jitterRadius, generator) - center + Point(0.5f, 0.5f);
        p = Point(float(x) / gridSize, float(y) / gridSize) + offs;
        // generate a new point until it is within the boundaries
      } while (!p.isInRectangle());

      if (isCircle)
        if (!p.isInCircle())
          continue;

      samplePoints.push_back(p);
    }
  }

  return samplePoints;
}